

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void slang::ast::CheckerInstanceSymbol::fromSyntax
               (CheckerSymbol *checker,HierarchyInstantiationSyntax *syntax,ASTContext *context,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets,
               bitmask<slang::ast::InstanceFlags> flags)

{
  Scope *this;
  SourceLocation SVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes_00;
  NetType *netType;
  CheckerSymbol *checker_00;
  code *ctx;
  SourceRange SVar2;
  Symbol *symbol;
  const_iterator __begin0;
  SmallVector<unsigned_int,_10UL> path;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  implicitNetNames;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe64;
  bitmask<slang::ast::InstanceFlags> in_stack_fffffffffffffe70;
  CheckerInstanceSymbol *local_188;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_180;
  Compilation *local_178;
  Compilation *local_170;
  iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*> local_168;
  SyntaxNode *local_158;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_150;
  pointer local_148;
  __extent_storage<18446744073709551615UL> _Stack_140;
  SmallVectorBase<unsigned_int> local_138 [2];
  undefined1 local_f8 [200];
  
  ctx = (code *)syntax;
  local_180 = results;
  local_170 = (Compilation *)checker;
  local_150 = implicitNets;
  if (syntax->parameters != (ParameterValueAssignmentSyntax *)0x0) {
    SVar2 = slang::syntax::SyntaxNode::sourceRange(&syntax->parameters->super_SyntaxNode);
    ctx = (code *)0x160006;
    ASTContext::addDiag(context,(DiagCode)0x160006,SVar2);
  }
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::SmallSet((SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
              *)local_f8);
  local_138[0].data_ = (pointer)local_138[0].firstElement;
  local_138[0].len = 0;
  local_138[0].cap = 10;
  this = (context->scope).ptr;
  local_178 = this->compilation;
  netType = Scope::getDefaultNetType(this);
  local_168.index = 0;
  local_158 = (SyntaxNode *)((syntax->instances).elements._M_extent._M_extent_value + 1 >> 1);
  local_168.list = &syntax->instances;
  for (; (local_168.list != &syntax->instances || ((SyntaxNode *)local_168.index != local_158));
      local_168.index = (long)(SyntaxKind *)local_168.index + 1) {
    checker_00 = (CheckerSymbol *)
                 slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
                 iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>::dereference
                           (&local_168);
    local_138[0].len = 0;
    anon_unknown.dwarf_139ea30::createImplicitNets
              ((HierarchicalInstanceSyntax *)checker_00,context,netType,flags,
               (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                *)local_f8,local_150);
    SVar1 = (checker_00->super_Symbol).location;
    if (SVar1 == (SourceLocation)0x0) {
      SVar2 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)checker_00);
      ASTContext::addDiag(context,(DiagCode)0x4e0006,SVar2);
      attributes._M_extent._M_extent_value._0_4_ = 0;
      attributes._M_ptr = (pointer)local_138;
      attributes._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffe54;
      local_188 = fromSyntax((CheckerInstanceSymbol *)local_178,(Compilation *)context,
                             (ASTContext *)local_170,checker_00,
                             (HierarchicalInstanceSyntax *)
                             (syntax->super_MemberSyntax).attributes.
                             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                             ._M_ptr,attributes,
                             (SmallVectorBase<unsigned_int> *)
                             (syntax->super_MemberSyntax).attributes.
                             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                             ._M_extent._M_extent_value,(bool)flags.m_bits,
                             (bitmask<slang::ast::InstanceFlags>)
                             (underlying_type)in_stack_fffffffffffffe60);
      ctx = (code *)&local_188;
      SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                ((SmallVectorBase<slang::ast::Symbol_const*> *)local_180,(Symbol **)ctx);
    }
    else {
      local_148 = (syntax->super_MemberSyntax).attributes.
                  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                  _M_ptr;
      _Stack_140._M_extent_value =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      in_stack_fffffffffffffe54 = (undefined4)(_Stack_140._M_extent_value >> 0x20);
      in_stack_fffffffffffffe60 = 0;
      attributes_00._M_extent._M_extent_value._0_4_ = (int)local_138;
      attributes_00._M_ptr = (pointer)_Stack_140._M_extent_value;
      attributes_00._M_extent._M_extent_value._4_4_ = (int)((ulong)local_138 >> 0x20);
      local_188 = (CheckerInstanceSymbol *)
                  anon_unknown_287::recurseCheckerArray
                            ((anon_unknown_287 *)local_178,local_170,checker_00,
                             (HierarchicalInstanceSyntax *)context,
                             *(ASTContext **)((long)SVar1 + 0x50),
                             (DimIterator)
                             (&(*(ASTContext **)((long)SVar1 + 0x50))->scope +
                             *(long *)((long)SVar1 + 0x58)),(DimIterator)local_148,attributes_00,
                             (SmallVectorBase<unsigned_int> *)
                             ((ulong)in_stack_fffffffffffffe64 << 0x20),(bool)flags.m_bits,
                             in_stack_fffffffffffffe70);
      ctx = (code *)&local_188;
      SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*const&>
                ((SmallVectorBase<slang::ast::Symbol_const*> *)local_180,(Symbol **)ctx);
    }
  }
  SmallVectorBase<unsigned_int>::cleanup(local_138,(EVP_PKEY_CTX *)ctx);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                 *)(local_f8 + 0x88));
  return;
}

Assistant:

void CheckerInstanceSymbol::fromSyntax(const CheckerSymbol& checker,
                                       const HierarchyInstantiationSyntax& syntax,
                                       const ASTContext& context,
                                       SmallVectorBase<const Symbol*>& results,
                                       SmallVectorBase<const Symbol*>& implicitNets,
                                       bitmask<InstanceFlags> flags) {
    createCheckers(checker, syntax, context, results, implicitNets,
                   /* isProcedural */ false, flags);
}